

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvim_rpc.hpp
# Opt level: O3

Object * __thiscall
nvim::NvimRPC::do_call<>(Object *__return_storage_ptr__,NvimRPC *this,string *method)

{
  ulong uVar1;
  undefined1 uVar2;
  uint16_t val;
  size_t in_RCX;
  size_t __n;
  sbuffer sbuf;
  Packer pk;
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  dst;
  convert<msgpack::v1::type::tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>,_void>
  local_d9;
  sbuffer local_d8;
  packer<msgpack::v1::sbuffer> local_c0;
  undefined1 local_b8 [24];
  unique_ptr<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_> local_a0;
  tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  local_98;
  object local_38;
  
  msgpack::v1::sbuffer::sbuffer(&local_d8,0x2000);
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0x94;
  local_c0.m_stream = &local_d8;
  msgpack::v1::sbuffer::write(&local_d8,(int)&local_98,(void *)0x1,in_RCX);
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0;
  msgpack::v1::sbuffer::write(&local_d8,(int)&local_98,(void *)0x1,in_RCX);
  uVar1 = this->msgid_;
  __n = uVar1 + 1;
  this->msgid_ = __n;
  uVar2 = (undefined1)uVar1;
  if (uVar1 < 0x100) {
    if (uVar1 < 0x80) {
      local_98.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = uVar2;
      msgpack::v1::sbuffer::write(&local_d8,(int)&local_98,(void *)0x1,__n);
    }
    else {
      local_98.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0xcc;
      local_98.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = uVar2;
      msgpack::v1::sbuffer::write(&local_d8,(int)&local_98,(void *)0x2,__n);
    }
  }
  else {
    local_98.
    super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
    .
    super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
    ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = (undefined1)(uVar1 >> 8);
    if (uVar1 < 0x10000) {
      local_98.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0xcd;
      local_98.
      super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
      .
      super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
      ._M_head_impl.super_variant<_cf2d41c5_>.which_._2_1_ = uVar2;
      msgpack::v1::sbuffer::write(&local_d8,(int)&local_98,(void *)0x3,__n);
    }
    else {
      __n = uVar1 >> 0x20;
      if (__n == 0) {
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0xce;
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._2_1_ = (undefined1)(uVar1 >> 0x10);
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._3_1_ =
             local_98.
             super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
             .
             super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
             ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_;
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = (undefined1)(uVar1 >> 0x18);
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>._4_1_ = uVar2;
        msgpack::v1::sbuffer::write(&local_d8,(int)&local_98,(void *)0x5,0);
      }
      else {
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0xcf;
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._2_1_ = (undefined1)(uVar1 >> 0x30);
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._3_1_ = (undefined1)(uVar1 >> 0x28);
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>._4_1_ = SUB81(uVar1 >> 0x20,0);
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>._5_4_ =
             (uint)(uVar1 >> 0x18) & 0xff | (uint)(uVar1 >> 8) & 0xff00 |
             (uint)(((uVar1 & 0xff00) << 0x28) >> 0x20) | (uint)((uVar1 << 0x38) >> 0x20);
        local_98.
        super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
        .
        super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
        ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = (undefined1)(uVar1 >> 0x38);
        msgpack::v1::sbuffer::write(&local_d8,(int)&local_98,(void *)0x9,__n);
      }
    }
  }
  msgpack::v1::adaptor::pack<std::__cxx11::string,void>::operator()(&local_98,&local_c0,method);
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0x90;
  msgpack::v1::sbuffer::write(local_c0.m_stream,(int)&local_98,(void *)0x1,__n);
  Socket::write(&this->socket_,(int)local_d8.m_data,(void *)local_d8.m_size,__n);
  Socket::read2((unpacked *)local_b8,&this->socket_,5.0);
  local_38.via.array.ptr = (object *)local_b8._16_8_;
  local_38._0_8_ = local_b8._0_8_;
  local_38.via.u64 = local_b8._8_8_;
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._0_1_ = 0;
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._1_1_ = 0;
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._2_1_ = 0;
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<3UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_._3_1_ = 0;
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Head_base<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
  ._M_head_impl.super_variant<_cf2d41c5_>.which_ = 0;
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .super__Head_base<1UL,_long,_false>._M_head_impl = 0;
  local_98.
  super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .
  super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
  .super__Head_base<0UL,_long,_false>._M_head_impl = 0;
  msgpack::v1::adaptor::
  convert<msgpack::v1::type::tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>,_void>
  ::operator()(&local_d9,(object *)&local_38,&local_98);
  boost::variant<$cf2d41c5$>::variant
            (&__return_storage_ptr__->super_variant<_cf2d41c5_>,(variant<_cf2d41c5_> *)&local_98);
  boost::variant<$cf2d41c5$>::destroy_content
            ((variant<_cf2d41c5_> *)
             &local_98.
              super_tuple<long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Tuple_impl<0UL,_long,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Tuple_impl<1UL,_long,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Tuple_impl<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>_>
              .
              super__Head_base<2UL,_msgpack::v1::type::basic_variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<char,_std::allocator<char>_>,_msgpack::v1::type::ext>,_false>
            );
  boost::variant<$cf2d41c5$>::destroy_content((variant<_cf2d41c5_> *)&local_98);
  if ((tuple<msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>)
      local_a0._M_t.
      super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>._M_t.
      super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>.
      super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl !=
      (_Head_base<0UL,_msgpack::v1::zone_*,_false>)0x0) {
    std::default_delete<msgpack::v1::zone>::operator()
              ((default_delete<msgpack::v1::zone> *)&local_a0,
               (zone *)local_a0._M_t.
                       super___uniq_ptr_impl<msgpack::v1::zone,_std::default_delete<msgpack::v1::zone>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_msgpack::v1::zone_*,_std::default_delete<msgpack::v1::zone>_>
                       .super__Head_base<0UL,_msgpack::v1::zone_*,_false>._M_head_impl);
  }
  free(local_d8.m_data);
  return __return_storage_ptr__;
}

Assistant:

Object NvimRPC::do_call(const std::string &method, const U&...u) {
    msgpack::sbuffer sbuf;
    detail::Packer pk(&sbuf);
    pk.pack_array(4) << (uint64_t)REQUEST
                     << msgid_++
                     << method;

    pk.pack_array(sizeof...(u));
    detail::pack(pk, u...);

    // msgpack::object_handle oh = msgpack::unpack(sbuf.data(), sbuf.size());
    // msgpack::object deserialized = oh.get();
    // std::cout << "sbuf = " << deserialized << std::endl;

    socket_.write(sbuf.data(), sbuf.size(), 5);

    msgpack::unpacked result = socket_.read2(5);
    msgpack::object obj(result.get());

    //TODO: full-state response handler should be implemented

    // std::cout << "res = " << obj << std::endl;
    msgpack::type::tuple<int64_t, int64_t, Object, Object> dst;
    // [type=1, msgid(uint), error(str?), result(...)]
    obj.convert(dst);
    return dst.get<3>();
}